

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error adios2_set_block_selection(adios2_variable *variable,size_t block_id)

{
  ulong in_RDI;
  string *in_stack_00000018;
  adios2_variable *in_stack_00000020;
  VariableBase *variableBase;
  allocator local_39;
  string local_38 [40];
  ulong local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for adios2_variable, in call to adios2_set_block_selection",&local_39);
  adios2::helper::CheckForNullptr<adios2_variable>(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  adios2::core::VariableBase::SetBlockSelection(local_10);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_block_selection(adios2_variable *variable, const size_t block_id)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_block_selection");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetBlockSelection(block_id);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_block_selection"));
    }
}